

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O3

XPKEntry * XPKEntry_New(size_t width,size_t height,int x,int y)

{
  XPKEntry *pXVar1;
  
  pXVar1 = (XPKEntry *)malloc(0x20);
  if (pXVar1 != (XPKEntry *)0x0) {
    pXVar1->width = (uint16_t)width;
    pXVar1->height = (uint16_t)height;
    pXVar1->x = (uint16_t)x;
    pXVar1->y = (uint16_t)y;
    pXVar1->data = (void *)0x0;
  }
  return pXVar1;
}

Assistant:

XPKEntry *
XPKEntry_New(const size_t width, const size_t height, const int x, const int y)
{
	XPKEntry *entry = malloc(sizeof(XPKEntry)); /* XXX check for malloc error */
	if (!entry) {
		return NULL;
	}
	entry->width = width;
	entry->height = height;
	entry->x = x;
	entry->y = y;
	entry->data = NULL;
	return entry;
}